

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

void http1_after_finish(http_s *h)

{
  uintptr_t uVar1;
  void *pvVar2;
  uintptr_t uVar3;
  FIOBJ FVar4;
  FIOBJ FVar5;
  timespec tVar6;
  
  uVar1 = (h->private_data).flag;
  *(byte *)(uVar1 + 0x102) = *(byte *)(uVar1 + 0x102) & 0xfe;
  if ((http_s *)(uVar1 + 0x68) == h) {
    http_s_destroy(h,*(uint8_t *)(*(long *)(uVar1 + 0x38) + 0x7a));
    pvVar2 = (h->private_data).vtbl;
    uVar3 = (h->private_data).flag;
    FVar4 = fiobj_hash_new();
    tVar6 = fio_last_tick();
    FVar5 = fiobj_hash_new();
    (h->private_data).vtbl = pvVar2;
    (h->private_data).flag = uVar3;
    (h->private_data).out_headers = FVar4;
    h->received_at = tVar6;
    h->method = 0;
    h->status_str = 0;
    h->version = 0;
    h->status = 200;
    h->path = 0;
    h->query = 0;
    h->headers = FVar5;
    h->cookies = 0;
    h->params = 0;
    h->body = 0;
    h->udata = (void *)0x0;
  }
  else {
    fiobj_free(h->method);
    fiobj_free(h->status_str);
    fiobj_free((h->private_data).out_headers);
    fiobj_free(h->headers);
    fiobj_free(h->version);
    fiobj_free(h->query);
    fiobj_free(h->path);
    fiobj_free(h->cookies);
    fiobj_free(h->body);
    fiobj_free(h->params);
    h->body = 0;
    h->udata = (void *)0x0;
    h->cookies = 0;
    h->params = 0;
    h->query = 0;
    h->headers = 0;
    h->status = 0;
    h->path = 0;
    h->status_str = 0;
    h->version = 0;
    (h->received_at).tv_nsec = 0;
    h->method = 0;
    (h->private_data).out_headers = 0;
    (h->received_at).tv_sec = 0;
    fio_free(h);
  }
  if (*(char *)(uVar1 + 0x100) != '\0') {
    fio_close(*(intptr_t *)(uVar1 + 0x30));
    return;
  }
  return;
}

Assistant:

static inline void http1_after_finish(http_s *h) {
  http1pr_s *p = handle2pr(h);
  p->stop = p->stop & (~1UL);
  if (h != &p->request) {
    http_s_destroy(h, 0);
    fio_free(h);
  } else {
    http_s_clear(h, p->p.settings->log);
  }
  if (p->close)
    fio_close(p->p.uuid);
}